

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_KnapsackSolver_ApproximateBestSubset_with_asset_Test::TestBody
          (CoinSelection_SelectCoins_KnapsackSolver_ApproximateBestSubset_with_asset_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  mapped_type_conflict *pmVar8;
  char *in_R9;
  Amount AVar9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CoinSelectionOption *in_stack_000002c8;
  UtxoFilter *in_stack_000002d0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_000002d8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelectionOption option;
  ConfidentialAssetId *in_stack_fffffffffffffba8;
  CoinSelectionOption *in_stack_fffffffffffffbb0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffbb8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  key_type *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  string local_380;
  AssertHelper local_360;
  Message local_358;
  string local_350;
  byte local_329;
  AssertionResult local_328;
  AssertHelper local_318;
  Message local_310;
  undefined4 local_304;
  size_type local_300;
  AssertionResult local_2f8;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined4 local_2d4;
  int64_t local_2d0;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined4 local_2a4;
  string local_2a0;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  size_type local_258;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined8 local_230;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined8 local_208;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  size_type local_1d8;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8 [8];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_178;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_160 [2];
  _func_int **local_130;
  undefined1 local_128;
  undefined1 local_120 [16];
  undefined1 local_110 [64];
  string local_d0 [3];
  char local_70 [112];
  
  GetElementsOption();
  cfd::CoinSelectionOption::SetFeeAsset(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x26e3b7);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_d0,&exp_dummy_asset_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                        in_stack_fffffffffffffbe8);
  *pmVar3 = 220000000;
  std::__cxx11::string::~string((string *)local_d0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x26e415);
  cfd::core::Amount::Amount((Amount *)local_110);
  AVar9 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_130 = (_func_int **)AVar9.amount_;
  local_128 = AVar9.ignore_check_;
  local_120._0_8_ = local_130;
  local_120[8] = local_128;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x26e488);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x26e495);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetElementsUtxoList();
      in_stack_fffffffffffffbc0 = local_160;
      in_stack_fffffffffffffbb8 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_110;
      in_stack_fffffffffffffbb0 = (CoinSelectionOption *)(local_110 + 0x10);
      in_stack_fffffffffffffba8 = (ConfidentialAssetId *)local_120;
      in_stack_fffffffffffffbc8 = (char *)0x0;
      in_R9 = local_70;
      cfd::CoinSelection::SelectCoins
                ((CoinSelection *)
                 ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (AmountMap *)
                 ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start,in_stack_000002d8,in_stack_000002d0,
                 in_stack_000002c8,
                 (Amount *)map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                 (AmountMap *)
                 map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (Amount *)map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                 (AmountMap *)map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffbc0);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffbc0);
    }
  }
  else {
    testing::Message::Message(local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3b0,
               "Expected: ret = exp_selection.SelectCoins( map_target_amount, GetElementsUtxoList(), exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message((Message *)0x26e6d5);
  }
  local_1d8 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_178);
  local_1dc = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
             (unsigned_long *)in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26e7ca);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3b2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message((Message *)0x26e82d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26e885);
  sVar5 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_178);
  if (sVar5 == 1) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_178,0);
    local_208 = 0x9502f90;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               (unsigned_long *)in_stack_fffffffffffffbb8,(long *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
    if (!bVar1) {
      testing::Message::Message(&local_210);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26e954);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x3b4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::Message::~Message((Message *)0x26e9b7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26ea0c);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_178,1);
    local_230 = 0x4a817c8;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               (unsigned_long *)in_stack_fffffffffffffbb8,(long *)in_stack_fffffffffffffbb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26eac5);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x3b5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x26eb28);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26eb7d);
  }
  local_258 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x26eb9e);
  local_25c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
             (unsigned_long *)in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26ec3b);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3b7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message((Message *)0x26ec9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26ecf6);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x26ed03);
  if (sVar6 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_2a0,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbe8);
    local_2a4 = 0xdf84758;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
               (long *)in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
    std::__cxx11::string::~string((string *)&local_2a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
    if (!bVar1) {
      testing::Message::Message(&local_2b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26ee10);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x3b9,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      testing::Message::~Message((Message *)0x26ee6d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26eec2);
  }
  local_2d0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_110);
  local_2d4 = 0xe10;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
             (long *)in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x26ef86);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3bb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message((Message *)0x26efe3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26f038);
  local_300 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x26f045);
  local_304 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
             (unsigned_long *)in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffbb0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_310);
    in_stack_fffffffffffffbe8 =
         (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0x26f0ee);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x3bc,(char *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::Message::~Message((Message *)0x26f14b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26f1a3);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x26f1b0);
  if (sVar7 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_350,&exp_dummy_asset_a);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           *)CONCAT17(uVar2,in_stack_fffffffffffffbf0),in_stack_fffffffffffffbe8);
    local_329 = ~*pmVar8 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffbb0,(bool *)in_stack_fffffffffffffba8,
               (type *)0x26f217);
    std::__cxx11::string::~string((string *)&local_350);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_380,(internal *)&local_328,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","true","false",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x3be,pcVar4);
      testing::internal::AssertHelper::operator=(&local_360,&local_358);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      std::__cxx11::string::~string((string *)&local_380);
      testing::Message::~Message((Message *)0x26f342);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26f3ba);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffbc0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x26f3e5);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x26f3f2);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x26f3ff);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x26f40c);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_KnapsackSolver_ApproximateBestSubset_with_asset)
{
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 220000000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 2);
  if (ret.size() == 1) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(156250000));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(78125000));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 234375000);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}